

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util_test.cc
# Opt level: O2

void __thiscall StringPieceUtilTestSplitStringPiece::Run(StringPieceUtilTestSplitStringPiece *this)

{
  StringPiece input_00;
  StringPiece input_01;
  StringPiece input_02;
  StringPiece input_03;
  Test *pTVar1;
  bool bVar2;
  StringPiece input_04;
  vector<StringPiece,_std::allocator<StringPiece>_> list;
  StringPiece local_60;
  string input;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input,"a:b:c",(allocator<char> *)&list);
  input_00.len_ = input._M_string_length;
  input_00.str_ = input._M_dataplus._M_p;
  SplitStringPiece(&list,input_00,':');
  testing::Test::Check
            (g_current_test,
             (long)list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_start == 0x30,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x1a,"list.size() == 3");
  pTVar1 = g_current_test;
  local_60.str_ = "a";
  local_60.len_ = 1;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_60);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x1c,"list[0] == \"a\"");
  pTVar1 = g_current_test;
  local_60.str_ = "b";
  local_60.len_ = 1;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start + 1,&local_60);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x1d,"list[1] == \"b\"");
  pTVar1 = g_current_test;
  local_60.str_ = "c";
  local_60.len_ = 1;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start + 2,&local_60);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x1e,"list[2] == \"c\"");
  std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
            (&list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
  std::__cxx11::string::~string((string *)&input);
  input._M_dataplus._M_p = (pointer)&input.field_2;
  input._M_string_length = 0;
  input.field_2._M_local_buf[0] = '\0';
  input_04.len_ = 0;
  input_04.str_ = input._M_dataplus._M_p;
  SplitStringPiece(&list,input_04,':');
  testing::Test::Check
            (g_current_test,
             (long)list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_start == 0x10,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x25,"list.size() == 1");
  pTVar1 = g_current_test;
  local_60.str_ = "";
  local_60.len_ = 0;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_60);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x27,"list[0] == \"\"");
  std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
            (&list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
  std::__cxx11::string::~string((string *)&input);
  std::__cxx11::string::string<std::allocator<char>>((string *)&input,"a",(allocator<char> *)&list);
  input_01.len_ = input._M_string_length;
  input_01.str_ = input._M_dataplus._M_p;
  SplitStringPiece(&list,input_01,':');
  testing::Test::Check
            (g_current_test,
             (long)list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_start == 0x10,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x2e,"list.size() == 1");
  pTVar1 = g_current_test;
  local_60.str_ = "a";
  local_60.len_ = 1;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_60);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x30,"list[0] == \"a\"");
  std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
            (&list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
  std::__cxx11::string::~string((string *)&input);
  std::__cxx11::string::string<std::allocator<char>>((string *)&input,":",(allocator<char> *)&list);
  input_02.len_ = input._M_string_length;
  input_02.str_ = input._M_dataplus._M_p;
  SplitStringPiece(&list,input_02,':');
  testing::Test::Check
            (g_current_test,
             (long)list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_start == 0x20,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x37,"list.size() == 2");
  pTVar1 = g_current_test;
  local_60.str_ = "";
  local_60.len_ = 0;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_60);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x39,"list[0] == \"\"");
  pTVar1 = g_current_test;
  local_60.str_ = "";
  local_60.len_ = 0;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start + 1,&local_60);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x3a,"list[1] == \"\"");
  std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
            (&list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
  std::__cxx11::string::~string((string *)&input);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input,":a:b:c:",(allocator<char> *)&list);
  input_03.len_ = input._M_string_length;
  input_03.str_ = input._M_dataplus._M_p;
  SplitStringPiece(&list,input_03,':');
  testing::Test::Check
            (g_current_test,
             (long)list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_start == 0x50,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x41,"list.size() == 5");
  pTVar1 = g_current_test;
  local_60.str_ = "";
  local_60.len_ = 0;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_60);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x43,"list[0] == \"\"");
  pTVar1 = g_current_test;
  local_60.str_ = "a";
  local_60.len_ = 1;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start + 1,&local_60);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x44,"list[1] == \"a\"");
  pTVar1 = g_current_test;
  local_60.str_ = "b";
  local_60.len_ = 1;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start + 2,&local_60);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x45,"list[2] == \"b\"");
  pTVar1 = g_current_test;
  local_60.str_ = "c";
  local_60.len_ = 1;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start + 3,&local_60);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x46,"list[3] == \"c\"");
  pTVar1 = g_current_test;
  local_60.str_ = "";
  local_60.len_ = 0;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start + 4,&local_60);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x47,"list[4] == \"\"");
  std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
            (&list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
  std::__cxx11::string::~string((string *)&input);
  return;
}

Assistant:

TEST(StringPieceUtilTest, SplitStringPiece) {
  {
    string input("a:b:c");
    vector<StringPiece> list = SplitStringPiece(input, ':');

    EXPECT_EQ(list.size(), 3);

    EXPECT_EQ(list[0], "a");
    EXPECT_EQ(list[1], "b");
    EXPECT_EQ(list[2], "c");
  }

  {
    string empty;
    vector<StringPiece> list = SplitStringPiece(empty, ':');

    EXPECT_EQ(list.size(), 1);

    EXPECT_EQ(list[0], "");
  }

  {
    string one("a");
    vector<StringPiece> list = SplitStringPiece(one, ':');

    EXPECT_EQ(list.size(), 1);

    EXPECT_EQ(list[0], "a");
  }

  {
    string sep_only(":");
    vector<StringPiece> list = SplitStringPiece(sep_only, ':');

    EXPECT_EQ(list.size(), 2);

    EXPECT_EQ(list[0], "");
    EXPECT_EQ(list[1], "");
  }

  {
    string sep(":a:b:c:");
    vector<StringPiece> list = SplitStringPiece(sep, ':');

    EXPECT_EQ(list.size(), 5);

    EXPECT_EQ(list[0], "");
    EXPECT_EQ(list[1], "a");
    EXPECT_EQ(list[2], "b");
    EXPECT_EQ(list[3], "c");
    EXPECT_EQ(list[4], "");
  }
}